

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser.cpp
# Opt level: O2

bool __thiscall QHttpHeaderParser::parseStatus(QHttpHeaderParser *this,QByteArrayView status)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  int iVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView other;
  QArrayDataPointer<char16_t> local_68;
  bool ok;
  QByteArrayView local_40;
  QByteArrayView status_local;
  
  status_local.m_data = status.m_data;
  status_local.m_size = status.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (10 < status_local.m_size) {
    qVar6 = QByteArrayView::lengthHelperCharArray("HTTP/",6);
    other.m_data = "HTTP/";
    other.m_size = qVar6;
    bVar4 = QByteArrayView::startsWith(&status_local,other);
    if (((bVar4) && (status_local.m_data[6] == '.')) && (status_local.m_data[8] == ' ')) {
      this->majorVersion = status_local.m_data[5] + -0x30;
      this->minorVersion = status_local.m_data[7] + -0x30;
      qVar7 = QByteArrayView::indexOf(&status_local,' ',9);
      qVar6 = qVar7;
      if (qVar7 < 9) {
        qVar6 = status_local.m_size;
      }
      local_40.m_data = status_local.m_data + 9;
      local_40.m_size = qVar6 + -9;
      ok = false;
      iVar5 = QByteArrayView::toInt(&local_40,&ok,10);
      this->statusCode = iVar5;
      if (qVar7 < 9) {
        local_68.size = 0;
        local_68.d._0_4_ = 0;
        local_68.d._4_4_ = 0;
        local_68.ptr._0_4_ = 0;
        local_68.ptr._4_4_ = 0;
      }
      else {
        QVar8.m_data = (storage_type *)(status_local.m_size - (qVar7 + 1));
        QVar8.m_size = (qsizetype)&local_68;
        QString::fromLatin1(QVar8);
      }
      pDVar2 = (this->reasonPhrase).d.d;
      pcVar3 = (this->reasonPhrase).d.ptr;
      *(undefined4 *)&(this->reasonPhrase).d.d = local_68.d._0_4_;
      *(undefined4 *)((long)&(this->reasonPhrase).d.d + 4) = local_68.d._4_4_;
      *(undefined4 *)&(this->reasonPhrase).d.ptr = local_68.ptr._0_4_;
      *(undefined4 *)((long)&(this->reasonPhrase).d.ptr + 4) = local_68.ptr._4_4_;
      qVar6 = (this->reasonPhrase).d.size;
      (this->reasonPhrase).d.size = local_68.size;
      local_68.d = pDVar2;
      local_68.ptr = pcVar3;
      local_68.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      bVar4 = false;
      if ((ok == true) && ((uint)this->majorVersion < 10)) {
        bVar4 = (uint)this->minorVersion < 10;
      }
      goto LAB_0018bdec;
    }
  }
  bVar4 = false;
LAB_0018bdec:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaderParser::parseStatus(QByteArrayView status)
{
    // from RFC 2616:
    //        Status-Line = HTTP-Version SP Status-Code SP Reason-Phrase CRLF
    //        HTTP-Version   = "HTTP" "/" 1*DIGIT "." 1*DIGIT
    // that makes: 'HTTP/n.n xxx Message'
    // byte count:  0123456789012

    static const int minLength = 11;
    static const int dotPos = 6;
    static const int spacePos = 8;
    static const char httpMagic[] = "HTTP/";

    if (status.size() < minLength
        || !status.startsWith(httpMagic)
        || status.at(dotPos) != '.'
        || status.at(spacePos) != ' ') {
        // I don't know how to parse this status line
        return false;
    }

    // optimize for the valid case: defer checking until the end
    majorVersion = status.at(dotPos - 1) - '0';
    minorVersion = status.at(dotPos + 1) - '0';

    int i = spacePos;
    qsizetype j = status.indexOf(' ', i + 1);
    const QByteArrayView code = j > i ? status.sliced(i + 1, j - i - 1)
                                      : status.sliced(i + 1);

    bool ok = false;
    statusCode = code.toInt(&ok);

    reasonPhrase = j > i ? QString::fromLatin1(status.sliced(j + 1))
                         : QString();

    return ok && uint(majorVersion) <= 9 && uint(minorVersion) <= 9;
}